

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O2

QpVector * __thiscall QpVector::repopulate(QpVector *this,QpVector *other)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  long lVar6;
  
  reset(this);
  piVar2 = (other->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (other->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 < other->num_nz; lVar6 = lVar6 + 1) {
    iVar1 = piVar2[lVar6];
    piVar4[lVar6] = iVar1;
    pdVar5[iVar1] = pdVar3[iVar1];
  }
  this->num_nz = other->num_nz;
  return this;
}

Assistant:

QpVector& repopulate(const QpVector& other) {
    reset();
    for (HighsInt i = 0; i < other.num_nz; i++) {
      index[i] = other.index[i];
      value[index[i]] = other.value[index[i]];
    }
    num_nz = other.num_nz;
    return *this;
  }